

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O2

int __thiscall ncnn::ConvolutionDepthWise::load_model(ConvolutionDepthWise *this,ModelBin *mb)

{
  undefined4 uVar1;
  Allocator *pAVar2;
  void *pvVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  Mat local_78;
  
  if (this->dynamic_weight != 0) {
    return 0;
  }
  (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->weight_data_size,0);
  piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (&this->weight_data != &local_78) {
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    piVar6 = (this->weight_data).refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        pAVar2 = (this->weight_data).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          free((this->weight_data).data);
        }
        else {
          (*pAVar2->_vptr_Allocator[3])();
        }
      }
    }
    (this->weight_data).data = local_78.data;
    piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    (this->weight_data).refcount = piVar6;
    (this->weight_data).elemsize = CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
    (this->weight_data).elempack = local_78.elempack;
    (this->weight_data).allocator = local_78.allocator;
    (this->weight_data).dims = local_78.dims;
    (this->weight_data).w = local_78.w;
    (this->weight_data).h = local_78.h;
    (this->weight_data).d = local_78.d;
    (this->weight_data).c = local_78.c;
    (this->weight_data).cstep = local_78.cstep;
  }
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if ((this->weight_data).data == (void *)0x0) {
    return -100;
  }
  if ((long)(this->weight_data).c * (this->weight_data).cstep == 0) {
    return -100;
  }
  if (this->bias_term != 0) {
    (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->num_output,1);
    piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (&this->bias_data != &local_78) {
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = (this->bias_data).refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          pAVar2 = (this->bias_data).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->bias_data).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->bias_data).data = local_78.data;
      piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      (this->bias_data).refcount = piVar6;
      (this->bias_data).elemsize = CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
      (this->bias_data).elempack = local_78.elempack;
      (this->bias_data).allocator = local_78.allocator;
      (this->bias_data).dims = local_78.dims;
      (this->bias_data).w = local_78.w;
      (this->bias_data).h = local_78.h;
      (this->bias_data).d = local_78.d;
      (this->bias_data).c = local_78.c;
      (this->bias_data).cstep = local_78.cstep;
    }
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          free(local_78.data);
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if ((this->bias_data).data == (void *)0x0) {
      return -100;
    }
    if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
      return -100;
    }
  }
  iVar5 = this->int8_scale_term;
  if (iVar5 == 1) {
LAB_003cb2a9:
    (*mb->_vptr_ModelBin[2])(&local_78,mb,(ulong)(uint)this->group,1);
    piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (&this->weight_data_int8_scales != &local_78) {
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = (this->weight_data_int8_scales).refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          pAVar2 = (this->weight_data_int8_scales).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->weight_data_int8_scales).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_int8_scales).data = local_78.data;
      piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      (this->weight_data_int8_scales).refcount = piVar6;
      (this->weight_data_int8_scales).elemsize =
           CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
      (this->weight_data_int8_scales).elempack = local_78.elempack;
      (this->weight_data_int8_scales).allocator = local_78.allocator;
      (this->weight_data_int8_scales).dims = local_78.dims;
      (this->weight_data_int8_scales).w = local_78.w;
      (this->weight_data_int8_scales).h = local_78.h;
      (this->weight_data_int8_scales).d = local_78.d;
      (this->weight_data_int8_scales).c = local_78.c;
      (this->weight_data_int8_scales).cstep = local_78.cstep;
    }
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          free(local_78.data);
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    (*mb->_vptr_ModelBin[2])(&local_78,mb,1);
    piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (&this->bottom_blob_int8_scales != &local_78) {
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = (this->bottom_blob_int8_scales).refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          pAVar2 = (this->bottom_blob_int8_scales).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->bottom_blob_int8_scales).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->bottom_blob_int8_scales).data = local_78.data;
      piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      (this->bottom_blob_int8_scales).refcount = piVar6;
      (this->bottom_blob_int8_scales).elemsize =
           CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
      (this->bottom_blob_int8_scales).elempack = local_78.elempack;
      (this->bottom_blob_int8_scales).allocator = local_78.allocator;
      (this->bottom_blob_int8_scales).dims = local_78.dims;
      (this->bottom_blob_int8_scales).w = local_78.w;
      (this->bottom_blob_int8_scales).h = local_78.h;
      (this->bottom_blob_int8_scales).d = local_78.d;
      (this->bottom_blob_int8_scales).c = local_78.c;
      (this->bottom_blob_int8_scales).cstep = local_78.cstep;
    }
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          free(local_78.data);
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    uVar1 = *(this->bottom_blob_int8_scales).data;
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    Mat::create(&local_78,this->group,4,(Allocator *)0x0);
    piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (&this->bottom_blob_int8_scales != &local_78) {
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = (this->bottom_blob_int8_scales).refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          pAVar2 = (this->bottom_blob_int8_scales).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->bottom_blob_int8_scales).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->bottom_blob_int8_scales).data = local_78.data;
      piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      (this->bottom_blob_int8_scales).refcount = piVar6;
      (this->bottom_blob_int8_scales).elemsize =
           CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
      (this->bottom_blob_int8_scales).elempack = local_78.elempack;
      (this->bottom_blob_int8_scales).allocator = local_78.allocator;
      (this->bottom_blob_int8_scales).dims = local_78.dims;
      (this->bottom_blob_int8_scales).w = local_78.w;
      (this->bottom_blob_int8_scales).h = local_78.h;
      (this->bottom_blob_int8_scales).d = local_78.d;
      (this->bottom_blob_int8_scales).c = local_78.c;
      (this->bottom_blob_int8_scales).cstep = local_78.cstep;
    }
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          free(local_78.data);
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    uVar4 = (this->bottom_blob_int8_scales).c * (int)(this->bottom_blob_int8_scales).cstep;
    pvVar3 = (this->bottom_blob_int8_scales).data;
    uVar8 = 0;
    uVar7 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar7 = uVar8;
    }
    for (; (int)uVar7 != (int)uVar8; uVar8 = uVar8 + 1) {
      *(undefined4 *)((long)pvVar3 + uVar8 * 4) = uVar1;
    }
  }
  else {
    if ((iVar5 != 2) && (iVar5 != 0x66)) {
      if (iVar5 != 0x65) goto LAB_003cba8e;
      goto LAB_003cb2a9;
    }
    (*mb->_vptr_ModelBin[2])(&local_78,mb,1);
    piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (&this->weight_data_int8_scales != &local_78) {
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = (this->weight_data_int8_scales).refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          pAVar2 = (this->weight_data_int8_scales).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->weight_data_int8_scales).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_int8_scales).data = local_78.data;
      piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      (this->weight_data_int8_scales).refcount = piVar6;
      (this->weight_data_int8_scales).elemsize =
           CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
      (this->weight_data_int8_scales).elempack = local_78.elempack;
      (this->weight_data_int8_scales).allocator = local_78.allocator;
      (this->weight_data_int8_scales).dims = local_78.dims;
      (this->weight_data_int8_scales).w = local_78.w;
      (this->weight_data_int8_scales).h = local_78.h;
      (this->weight_data_int8_scales).d = local_78.d;
      (this->weight_data_int8_scales).c = local_78.c;
      (this->weight_data_int8_scales).cstep = local_78.cstep;
    }
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          free(local_78.data);
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    (*mb->_vptr_ModelBin[2])(&local_78,mb,1);
    piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (&this->bottom_blob_int8_scales != &local_78) {
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = (this->bottom_blob_int8_scales).refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          pAVar2 = (this->bottom_blob_int8_scales).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->bottom_blob_int8_scales).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->bottom_blob_int8_scales).data = local_78.data;
      piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      (this->bottom_blob_int8_scales).refcount = piVar6;
      (this->bottom_blob_int8_scales).elemsize =
           CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
      (this->bottom_blob_int8_scales).elempack = local_78.elempack;
      (this->bottom_blob_int8_scales).allocator = local_78.allocator;
      (this->bottom_blob_int8_scales).dims = local_78.dims;
      (this->bottom_blob_int8_scales).w = local_78.w;
      (this->bottom_blob_int8_scales).h = local_78.h;
      (this->bottom_blob_int8_scales).d = local_78.d;
      (this->bottom_blob_int8_scales).c = local_78.c;
      (this->bottom_blob_int8_scales).cstep = local_78.cstep;
    }
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          free(local_78.data);
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    uVar1 = *(this->weight_data_int8_scales).data;
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    Mat::create(&local_78,this->group,4,(Allocator *)0x0);
    piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (&this->weight_data_int8_scales != &local_78) {
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = (this->weight_data_int8_scales).refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          pAVar2 = (this->weight_data_int8_scales).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->weight_data_int8_scales).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_int8_scales).data = local_78.data;
      piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      (this->weight_data_int8_scales).refcount = piVar6;
      (this->weight_data_int8_scales).elemsize =
           CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
      (this->weight_data_int8_scales).elempack = local_78.elempack;
      (this->weight_data_int8_scales).allocator = local_78.allocator;
      (this->weight_data_int8_scales).dims = local_78.dims;
      (this->weight_data_int8_scales).w = local_78.w;
      (this->weight_data_int8_scales).h = local_78.h;
      (this->weight_data_int8_scales).d = local_78.d;
      (this->weight_data_int8_scales).c = local_78.c;
      (this->weight_data_int8_scales).cstep = local_78.cstep;
    }
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          free(local_78.data);
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    uVar4 = (this->weight_data_int8_scales).c * (int)(this->weight_data_int8_scales).cstep;
    pvVar3 = (this->weight_data_int8_scales).data;
    uVar8 = 0;
    uVar7 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar7 = uVar8;
    }
    for (; (int)uVar7 != (int)uVar8; uVar8 = uVar8 + 1) {
      *(undefined4 *)((long)pvVar3 + uVar8 * 4) = uVar1;
    }
    uVar1 = *(this->bottom_blob_int8_scales).data;
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    Mat::create(&local_78,this->group,4,(Allocator *)0x0);
    piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (&this->bottom_blob_int8_scales != &local_78) {
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + 1;
        UNLOCK();
      }
      piVar6 = (this->bottom_blob_int8_scales).refcount;
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          pAVar2 = (this->bottom_blob_int8_scales).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->bottom_blob_int8_scales).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      (this->bottom_blob_int8_scales).data = local_78.data;
      piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      (this->bottom_blob_int8_scales).refcount = piVar6;
      (this->bottom_blob_int8_scales).elemsize =
           CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
      (this->bottom_blob_int8_scales).elempack = local_78.elempack;
      (this->bottom_blob_int8_scales).allocator = local_78.allocator;
      (this->bottom_blob_int8_scales).dims = local_78.dims;
      (this->bottom_blob_int8_scales).w = local_78.w;
      (this->bottom_blob_int8_scales).h = local_78.h;
      (this->bottom_blob_int8_scales).d = local_78.d;
      (this->bottom_blob_int8_scales).c = local_78.c;
      (this->bottom_blob_int8_scales).cstep = local_78.cstep;
    }
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          free(local_78.data);
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    uVar4 = (this->bottom_blob_int8_scales).c * (int)(this->bottom_blob_int8_scales).cstep;
    pvVar3 = (this->bottom_blob_int8_scales).data;
    uVar8 = 0;
    uVar7 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar7 = uVar8;
    }
    for (; (int)uVar7 != (int)uVar8; uVar8 = uVar8 + 1) {
      *(undefined4 *)((long)pvVar3 + uVar8 * 4) = uVar1;
    }
  }
  iVar5 = this->int8_scale_term;
LAB_003cba8e:
  if (iVar5 < 0x65) {
    return 0;
  }
  (*mb->_vptr_ModelBin[2])(&local_78,mb,1);
  piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (&this->top_blob_int8_scales != &local_78) {
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    piVar6 = (this->top_blob_int8_scales).refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        pAVar2 = (this->top_blob_int8_scales).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          free((this->top_blob_int8_scales).data);
        }
        else {
          (*pAVar2->_vptr_Allocator[3])();
        }
      }
    }
    (this->top_blob_int8_scales).data = local_78.data;
    piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    (this->top_blob_int8_scales).refcount = piVar6;
    (this->top_blob_int8_scales).elemsize =
         CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
    (this->top_blob_int8_scales).elempack = local_78.elempack;
    (this->top_blob_int8_scales).allocator = local_78.allocator;
    (this->top_blob_int8_scales).dims = local_78.dims;
    (this->top_blob_int8_scales).w = local_78.w;
    (this->top_blob_int8_scales).h = local_78.h;
    (this->top_blob_int8_scales).d = local_78.d;
    (this->top_blob_int8_scales).c = local_78.c;
    (this->top_blob_int8_scales).cstep = local_78.cstep;
  }
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  uVar1 = *(this->top_blob_int8_scales).data;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,this->group,4,(Allocator *)0x0);
  piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (&this->top_blob_int8_scales != &local_78) {
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    piVar6 = (this->top_blob_int8_scales).refcount;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        pAVar2 = (this->top_blob_int8_scales).allocator;
        if (pAVar2 == (Allocator *)0x0) {
          free((this->top_blob_int8_scales).data);
        }
        else {
          (*pAVar2->_vptr_Allocator[3])();
        }
      }
    }
    (this->top_blob_int8_scales).data = local_78.data;
    piVar6 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    (this->top_blob_int8_scales).refcount = piVar6;
    (this->top_blob_int8_scales).elemsize =
         CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
    (this->top_blob_int8_scales).elempack = local_78.elempack;
    (this->top_blob_int8_scales).allocator = local_78.allocator;
    (this->top_blob_int8_scales).dims = local_78.dims;
    (this->top_blob_int8_scales).w = local_78.w;
    (this->top_blob_int8_scales).h = local_78.h;
    (this->top_blob_int8_scales).d = local_78.d;
    (this->top_blob_int8_scales).c = local_78.c;
    (this->top_blob_int8_scales).cstep = local_78.cstep;
  }
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  iVar5 = (this->top_blob_int8_scales).c * (int)(this->top_blob_int8_scales).cstep;
  pvVar3 = (this->top_blob_int8_scales).data;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  for (lVar9 = 0; iVar5 != (int)lVar9; lVar9 = lVar9 + 1) {
    *(undefined4 *)((long)pvVar3 + lVar9 * 4) = uVar1;
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise::load_model(const ModelBin& mb)
{
    if (dynamic_weight)
        return 0;

    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

#if NCNN_INT8
    if (int8_scale_term == 1 || int8_scale_term == 101)
    {
        weight_data_int8_scales = mb.load(group, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }
    else if (int8_scale_term == 2 || int8_scale_term == 102)
    {
        weight_data_int8_scales = mb.load(1, 1);
        bottom_blob_int8_scales = mb.load(1, 1);

        // extend group if only one provided
        float weight_data_int8_scale = weight_data_int8_scales[0];
        weight_data_int8_scales = Mat(group);
        weight_data_int8_scales.fill(weight_data_int8_scale);

        float bottom_blob_int8_scale = bottom_blob_int8_scales[0];
        bottom_blob_int8_scales = Mat(group);
        bottom_blob_int8_scales.fill(bottom_blob_int8_scale);
    }

    if (int8_scale_term > 100)
    {
        top_blob_int8_scales = mb.load(1, 1);

        float top_blob_int8_scale = top_blob_int8_scales[0];
        top_blob_int8_scales = Mat(group);
        top_blob_int8_scales.fill(top_blob_int8_scale);
    }
#endif // NCNN_INT8

    return 0;
}